

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_ipp.hpp
# Opt level: O0

void duckdb::shared_ptr<duckdb::SetOpRelation,_true>::AssertNotNull(bool null)

{
  InternalException *this;
  byte in_DIL;
  allocator local_29;
  string local_28 [39];
  byte local_1;
  
  local_1 = in_DIL & 1;
  if (local_1 != 0) {
    this = (InternalException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_28,"Attempted to dereference shared_ptr that is NULL!",&local_29);
    duckdb::InternalException::InternalException(this,local_28);
    __cxa_throw(this,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return;
}

Assistant:

static inline void AssertNotNull(const bool null) {
#if defined(DUCKDB_DEBUG_NO_SAFETY) || defined(DUCKDB_CLANG_TIDY)
		return;
#else
		if (DUCKDB_UNLIKELY(null)) {
			throw duckdb::InternalException("Attempted to dereference shared_ptr that is NULL!");
		}
#endif
	}